

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool __thiscall libcellml::Units::removeUnit(Units *this,StandardUnit standardUnit)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  undefined1 local_38 [8];
  string reference;
  StandardUnit standardUnit_local;
  Units *this_local;
  
  reference.field_2._12_4_ = standardUnit;
  local_40._M_node =
       (_Base_ptr)
       std::
       map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find((map<libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libcellml::Units::StandardUnit>,_std::allocator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)standardUnitToString_abi_cxx11_,(key_type *)(reference.field_2._M_local_buf + 0xc))
  ;
  ppVar2 = std::
           _Rb_tree_const_iterator<std::pair<const_libcellml::Units::StandardUnit,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_40);
  std::__cxx11::string::string((string *)local_38,(string *)&ppVar2->second);
  bVar1 = removeUnit(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return bVar1;
}

Assistant:

bool Units::removeUnit(StandardUnit standardUnit)
{
    const std::string reference = standardUnitToString.find(standardUnit)->second;
    return removeUnit(reference);
}